

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddExtension<google::protobuf::FieldDescriptorProto>
          (DescriptorIndex *this,StringPiece filename,FieldDescriptorProto *field)

{
  bool bVar1;
  int32_t value;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  size_type sVar5;
  LogMessage *pLVar6;
  bool local_15a;
  LogFinisher local_129;
  LogMessage local_128;
  DescriptorIndex *local_f0;
  byte local_e1;
  int32_t local_e0;
  byte local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_b8;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_90;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_88;
  StringPiece local_70;
  value_type local_60;
  FieldDescriptorProto *local_30;
  FieldDescriptorProto *field_local;
  DescriptorIndex *this_local;
  StringPiece filename_local;
  
  filename_local.ptr_ = (char *)filename.length_;
  this_local = (DescriptorIndex *)filename.ptr_;
  local_30 = field;
  field_local = (FieldDescriptorProto *)this;
  FieldDescriptorProto::extendee_abi_cxx11_(field);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar3);
    if (*pcVar4 == '.') {
      sVar5 = std::
              vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
              ::size(&this->all_values_);
      local_60.data_offset = (int)sVar5 + -1;
      psVar3 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_70,psVar3);
      EncodeString_abi_cxx11_(&local_60.encoded_extendee,this,local_70);
      local_d9 = 0;
      local_e1 = 0;
      local_60.extension_number = FieldDescriptorProto::number(local_30);
      bVar1 = InsertIfNotPresent<std::set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>
                        (&this->by_extension_,&local_60);
      local_15a = true;
      if (bVar1) {
        local_88._M_current =
             (ExtensionEntry *)
             std::
             vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
             ::begin(&this->by_extension_flat_);
        local_90._M_current =
             (ExtensionEntry *)
             std::
             vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
             ::end(&this->by_extension_flat_);
        psVar3 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)psVar3);
        local_d9 = 1;
        local_e0 = FieldDescriptorProto::number(local_30);
        std::make_pair<std::__cxx11::string,int>(&local_b8,&local_d8,&local_e0);
        local_e1 = 1;
        local_f0 = (DescriptorIndex *)
                   std::
                   set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
                   ::key_comp(&this->by_extension_);
        local_15a = std::
                    binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::pair<std::__cxx11::string,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                              (local_88,local_90,&local_b8,(ExtensionCompare)local_f0);
      }
      if ((local_e1 & 1) != 0) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
        ~pair(&local_b8);
      }
      if ((local_d9 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_d8);
      }
      ExtensionEntry::~ExtensionEntry(&local_60);
      if (local_15a != false) {
        internal::LogMessage::LogMessage
                  (&local_128,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x2f4);
        pLVar6 = internal::LogMessage::operator<<
                           (&local_128,
                            "Extension conflicts with extension already in database: extend ");
        psVar3 = FieldDescriptorProto::extendee_abi_cxx11_(local_30);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,psVar3);
        pLVar6 = internal::LogMessage::operator<<(pLVar6," { ");
        psVar3 = FieldDescriptorProto::name_abi_cxx11_(local_30);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,psVar3);
        pLVar6 = internal::LogMessage::operator<<(pLVar6," = ");
        value = FieldDescriptorProto::number(local_30);
        pLVar6 = internal::LogMessage::operator<<(pLVar6,value);
        pLVar6 = internal::LogMessage::operator<<(pLVar6," } from:");
        pLVar6 = internal::LogMessage::operator<<(pLVar6,(StringPiece *)&this_local);
        internal::LogFinisher::operator=(&local_129,pLVar6);
        internal::LogMessage::~LogMessage(&local_128);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddExtension(
    StringPiece filename, const FieldProto& field) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            ExtensionEntry{static_cast<int>(all_values_.size() - 1),
                           EncodeString(field.extendee()), field.number()}) ||
        std::binary_search(
            by_extension_flat_.begin(), by_extension_flat_.end(),
            std::make_pair(field.extendee().substr(1), field.number()),
            by_extension_.key_comp())) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend "
                 << field.extendee() << " { " << field.name() << " = "
                 << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}